

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O1

void __thiscall
CombinedSeismogramm<float,_2>::AddComponent
          (CombinedSeismogramm<float,_2> *this,string *path,
          ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *getter)

{
  ComponentInfo local_38;
  
  ComponentInfo::ComponentInfo(&local_38,path,getter);
  std::
  vector<CombinedSeismogramm<float,2>::ComponentInfo,std::allocator<CombinedSeismogramm<float,2>::ComponentInfo>>
  ::emplace_back<CombinedSeismogramm<float,2>::ComponentInfo>
            ((vector<CombinedSeismogramm<float,2>::ComponentInfo,std::allocator<CombinedSeismogramm<float,2>::ComponentInfo>>
              *)&this->componentInfos,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.path._M_dataplus._M_p != &local_38.path.field_2) {
    operator_delete(local_38.path._M_dataplus._M_p,local_38.path.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::AddComponent(const std::string& path, ValueGetter<Elastic, dims>* getter)
{
    componentInfos.push_back(ComponentInfo(path, getter));
}